

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O0

vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_> *
__thiscall
program_options::command_line_parser::parse_long_option
          (command_line_parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  string *original_token;
  iterator this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  command_line_parser *in_RSI;
  invalid_command_line_syntax *in_RDI;
  option opt;
  size_type p;
  string adjacent;
  string name;
  string *tok;
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  *result;
  basic_option<char> *in_stack_fffffffffffffe70;
  int option_style;
  value_type *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  const_iterator in_stack_fffffffffffffe88;
  kind_t kind;
  invalid_command_line_syntax *this_01;
  string local_140 [96];
  string local_e0 [32];
  string local_c0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long local_70;
  string local_68 [32];
  string local_48 [32];
  reference local_28;
  undefined1 local_19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_19 = 0;
  this_01 = in_RDI;
  local_18 = in_RDX;
  std::
  vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  ::vector((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
            *)0x1ff4f6);
  local_28 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_18,0);
  uVar2 = std::__cxx11::string::size();
  if (((2 < uVar2) &&
      (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_28), *pcVar3 == '-')) &&
     (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_28), *pcVar3 == '-')) {
    std::__cxx11::string::string(local_48);
    std::__cxx11::string::string(local_68);
    local_70 = std::__cxx11::string::find((char)local_28,0x3d);
    if (local_70 == -1) {
      std::__cxx11::string::substr((ulong)local_e0,(ulong)local_28);
      std::__cxx11::string::operator=(local_48,local_e0);
      std::__cxx11::string::~string(local_e0);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_90,(ulong)local_28);
      in_stack_fffffffffffffe88._M_current = &local_90;
      std::__cxx11::string::operator=(local_48,(string *)in_stack_fffffffffffffe88._M_current);
      std::__cxx11::string::~string((string *)in_stack_fffffffffffffe88._M_current);
      std::__cxx11::string::substr((ulong)local_c0,(ulong)local_28);
      std::__cxx11::string::operator=(local_68,local_c0);
      std::__cxx11::string::~string(local_c0);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        original_token = (string *)__cxa_allocate_exception(0xc0);
        kind = (kind_t)((ulong)in_stack_fffffffffffffe88._M_current >> 0x20);
        option_style = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
        iVar1 = get_canonical_option_prefix(in_RSI);
        invalid_command_line_syntax::invalid_command_line_syntax
                  (this_01,kind,(string *)CONCAT44(iVar1,in_stack_fffffffffffffe80),original_token,
                   option_style);
        __cxa_throw(original_token,&invalid_command_line_syntax::typeinfo,
                    invalid_command_line_syntax::~invalid_command_line_syntax);
      }
    }
    basic_option<char>::basic_option(in_stack_fffffffffffffe70);
    std::__cxx11::string::operator=(local_140,local_48);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                  &in_stack_fffffffffffffe78->string_key);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                &in_stack_fffffffffffffe78->string_key);
    std::
    vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ::push_back((vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                in_stack_fffffffffffffe78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin(local_18);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffe70,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_18);
    this_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                      in_stack_fffffffffffffe88);
    basic_option<char>::~basic_option((basic_option<char> *)this_00._M_current);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
  }
  return (vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
          *)in_RDI;
}

Assistant:

std::vector<option>
command_line_parser::parse_long_option(std::vector<std::string>& args)
{
    std::vector<option> result;
    const std::string& tok = args[0];
    if (tok.size() >= 3 && tok[0] == '-' && tok[1] == '-')
    {
        std::string name, adjacent;

        std::string::size_type p = tok.find('=');
        if (p != tok.npos)
        {
            name = tok.substr(2, p-2);
            adjacent = tok.substr(p+1);
            if (adjacent.empty()) {
                throw invalid_command_line_syntax(
                    invalid_command_line_syntax::empty_adjacent_parameter,
                    name, name,
                    get_canonical_option_prefix());
            }
        }
        else
        {
            name = tok.substr(2);
        }
        option opt;
        opt.string_key = name;
        if (!adjacent.empty())
            opt.value.push_back(adjacent);
        opt.original_tokens.push_back(tok);
        result.push_back(opt);
        args.erase(args.begin());
    }
    return result;
}